

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O3

int main(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  CMUnitTest tests [17];
  CMUnitTest aCStack_2b8 [17];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar5 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar5 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar7 = "Prescott";
            goto LAB_0010359a;
          }
          if (uVar3 == 0x66) {
            pcVar7 = "Presler";
            goto LAB_0010359a;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar7 = "Dothan";
            goto LAB_0010359a;
          }
          if (uVar3 == 0x6f) goto switchD_00103347_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar7 = "Pineview";
            goto LAB_0010359a;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar5 = (long)&switchD_00103347::switchdataD_0011605c +
                  (long)(int)(&switchD_00103347::switchdataD_0011605c)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00103347_caseD_0:
            pcVar7 = "Merom";
            goto LAB_0010359a;
          case 1:
          case 7:
            pcVar7 = "Penryn";
            goto LAB_0010359a;
          case 4:
          case 8:
switchD_00103347_caseD_4:
            pcVar7 = "Nehalem";
            goto LAB_0010359a;
          }
        }
        else {
          uVar5 = uVar6;
          if (uVar3 == 0x266) {
            pcVar7 = "Lincroft";
            goto LAB_0010359a;
          }
          if (uVar3 == 0x366) {
            pcVar7 = "Cedarview";
            goto LAB_0010359a;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar5 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "Westmere";
          goto LAB_0010359a;
        }
        uVar5 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar7 = "SandyBridge";
          goto LAB_0010359a;
        }
        if (uVar3 == 9) goto switchD_00103347_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar7 = "IvyBridge";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x306c) {
        pcVar7 = "Haswell";
        goto LAB_0010359a;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar7 = "Broadwell";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x30f1) goto LAB_0010352d;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar7 = "CherryTrail";
          goto LAB_0010359a;
        }
        if (uVar3 == 0x506c) goto LAB_001034cd;
        if (uVar3 == 0x506e) {
          pcVar7 = "Skylake";
          goto LAB_0010359a;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_001034d9:
          pcVar7 = "Icelake";
          goto LAB_0010359a;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_0010352d:
          pcVar7 = "Zen2";
          goto LAB_0010359a;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_001034cd:
        pcVar7 = "Goldmont";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x706e) goto LAB_001034d9;
      if (uVar3 == 0x70f1) goto LAB_0010352d;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar7 = "TigerLake";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x806e) {
LAB_0010353d:
        pcVar7 = "Kabylake";
        goto LAB_0010359a;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar7 = "Alderlake";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x906e) goto LAB_0010353d;
    }
    else {
      uVar5 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar7 = "Cometlake";
        goto LAB_0010359a;
      }
      if (uVar3 == 0x90f0) goto LAB_0010352d;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar7 = "Rocketlake";
      goto LAB_0010359a;
    }
    if (uVar3 == 0xb067) {
      pcVar7 = "Raptorlake";
      goto LAB_0010359a;
    }
    if (uVar3 == 0x20f10) goto LAB_001034e5;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar7 = "Zen3+";
      goto LAB_0010359a;
    }
    if (uVar3 == 0x50f00) {
LAB_001034e5:
      pcVar7 = "Zen3";
      goto LAB_0010359a;
    }
    if (uVar3 == 0x60f10) {
      pcVar7 = "Zen4";
      goto LAB_0010359a;
    }
  }
  pcVar7 = "unknown";
LAB_0010359a:
  printf("x64 processor:  %s\t",pcVar7,(ulong)puVar1[2],uVar5);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar2 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar2 + 0xc) != '@') {
    lVar2 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(undefined4 *)(lVar2 + 0xc),
           (ulong)*(uint *)(lVar2 + 8));
  }
  memcpy(aCStack_2b8,&PTR_anon_var_dwarf_7a_00121b30,0x2a8);
  iVar4 = _cmocka_run_group_tests
                    ("tests",aCStack_2b8,0x11,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar4;
}

Assistant:

int main() {
    tellmeall();
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(equal_array_array_test),
        cmocka_unit_test(equal_bitset_bitset_test),
        cmocka_unit_test(equal_run_run_test),
        cmocka_unit_test(equal_array_bitset_test),
        cmocka_unit_test(equal_bitset_array_test),
        cmocka_unit_test(equal_array_run_test),
        cmocka_unit_test(equal_run_array_test),
        cmocka_unit_test(equal_bitset_run_test),
        cmocka_unit_test(equal_run_bitset_test),
        cmocka_unit_test(subset_array_array_test),
        cmocka_unit_test(subset_bitset_bitset_test),
        cmocka_unit_test(subset_run_run_test),
        cmocka_unit_test(subset_array_bitset_test),
        cmocka_unit_test(subset_array_run_test),
        cmocka_unit_test(subset_run_array_test),
        cmocka_unit_test(subset_bitset_run_test),
        cmocka_unit_test(subset_run_bitset_test),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}